

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic_simplification.hpp
# Opt level: O2

uint32_t __thiscall
optimization::algebraic_simplification::AlgebraicSimplification::getNewVar
          (AlgebraicSimplification *this,MirFunction *func)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_color _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  SharedTyPtr local_88;
  Variable local_78;
  pair<unsigned_int,_mir::inst::Variable> local_58;
  
  _Var2 = _S_black;
  for (p_Var1 = (func->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(func->variables)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (_Var2 < p_Var1[1]._M_color) {
      _Var2 = p_Var1[1]._M_color;
    }
  }
  std::make_shared<mir::types::IntTy>();
  local_88.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_90._M_pi;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mir::inst::Variable::Variable(&local_78,&local_88,false,true,false);
  local_58.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001daf78;
  local_58.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_78.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_78.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  local_78.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_78.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58.second.is_memory_var = local_78.is_memory_var;
  local_58.second.is_temp_var = local_78.is_temp_var;
  local_58.second.is_phi_var = local_78.is_phi_var;
  local_58.second._27_1_ = local_78._27_1_;
  local_58.second.priority = local_78.priority;
  local_58.first = _Var2 + _S_black;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::_M_emplace_unique<std::pair<unsigned_int,mir::inst::Variable>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
              *)&func->variables,&local_58);
  mir::inst::Variable::~Variable(&local_58.second);
  mir::inst::Variable::~Variable(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_90);
  return _Var2 + _S_black;
}

Assistant:

uint32_t getNewVar(mir::inst::MirFunction& func) {
    uint32_t maxId = 1;
    for (auto& var : func.variables) {
      if (var.first > maxId) {
        maxId = var.first;
      }
    }
    func.variables.insert(std::pair<uint32_t, mir::inst::Variable>(
        ++maxId, mir::inst::Variable(mir::types::SharedTyPtr(
                                         std::make_shared<mir::types::IntTy>()),
                                     false, true)));
    return maxId;
  }